

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O1

void __thiscall
wasm::WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>::
runOnFunction(WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
              *this,Module *module,Function *func)

{
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    (this->super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>).
    super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currModule = module;
    (this->super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>).
    super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currFunction = func;
    LocalCSE::doWalkFunction((LocalCSE *)this,func);
    (this->super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>).
    super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currFunction =
         (Function *)0x0;
    (this->super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>).
    super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currModule = (Module *)0x0;
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x223,
                "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::LocalCSE>>::runOnFunction(Module *, Function *) [WalkerType = wasm::PostWalker<wasm::LocalCSE>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }